

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# record-replay.cpp
# Opt level: O2

int replay_match_victim_pedigree_internal(__cilkrts_worker *w,__cilkrts_worker *victim)

{
  bool bVar1;
  replay_entry_t *prVar2;
  
  bVar1 = replay_entry_t::match
                    (w->l->replay_list_entry,ped_type_steal,
                     &((*victim->head)->field_9).spawn_helper_pedigree,victim->self);
  if (bVar1) {
    prVar2 = replay_entry_t::next_entry(w->l->replay_list_entry);
    w->l->replay_list_entry = prVar2;
  }
  return (uint)bVar1;
}

Assistant:

int replay_match_victim_pedigree_internal(__cilkrts_worker *w, __cilkrts_worker *victim)
{
    // If we don't have a match, return 0
    if (! w->l->replay_list_entry->match(ped_type_steal,
                                             &((*victim->head)->parent_pedigree),
                                             victim->self))
        return 0;

    // Consume this entry
    w->l->replay_list_entry = w->l->replay_list_entry->next_entry();

    // Return success
    return 1;
}